

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

bool embree::sse42::InstanceArrayIntersector1::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  long *plVar6;
  long lVar7;
  float fVar8;
  float *pfVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  undefined8 uVar11;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  _func_int *p_Var15;
  float fVar16;
  undefined1 in_XMM0 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar22;
  float fVar23;
  undefined1 in_XMM1 [16];
  undefined1 auVar21 [16];
  vfloat4 l02;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 in_XMM4 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar34;
  float fVar35;
  undefined1 auVar36 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 in_XMM7 [16];
  vfloat4 a0;
  float fVar43;
  float fVar44;
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar49;
  float fVar50;
  undefined1 in_XMM11 [16];
  undefined1 auVar48 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 in_XMM12 [16];
  float fVar54;
  float fVar55;
  RayQueryContext newcontext;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar26 [16];
  
  auVar36 = in_XMM5._0_12_;
  uVar2 = prim->primID_;
  pGVar4 = (context->scene->geometries).items[prim->instID_].ptr;
  if ((((*(long *)&pGVar4->field_0x58 == 0) &&
       ((uVar13 = (ulong)*(uint *)(*(long *)&pGVar4[1].time_range.upper +
                                  (long)pGVar4[1].intersectionFilterN * (ulong)uVar2),
        uVar13 == 0xffffffff ||
        (pGVar4[1].super_RefCount._vptr_RefCount[uVar13] == (_func_int *)0x0)))) ||
      ((ray->mask & pGVar4->mask) == 0)) ||
     (pRVar5 = context->user, pRVar5->instID[0] != 0xffffffff)) {
    bVar12 = false;
  }
  else {
    pRVar5->instID[0] = prim->instID_;
    pRVar5->instPrimID[0] = uVar2;
    uVar13 = (ulong)prim->primID_;
    plVar6 = *(long **)&pGVar4[1].fnumTimeSegments;
    iVar3 = (int)plVar6[4];
    if ((pGVar4->field_8).field_0x1 == '\x01') {
      if (iVar3 == 0x9134) {
        lVar7 = *plVar6;
        lVar14 = plVar6[2] * uVar13;
        auVar18 = insertps(ZEXT416(*(uint *)(lVar7 + lVar14)),*(undefined4 *)(lVar7 + 0x10 + lVar14)
                           ,0x1c);
        in_XMM0 = insertps(auVar18,*(undefined4 *)(lVar7 + 0x20 + lVar14),0x28);
        auVar18 = insertps(ZEXT416(*(uint *)(lVar7 + 4 + lVar14)),
                           *(undefined4 *)(lVar7 + 0x14 + lVar14),0x1c);
        in_XMM12 = insertps(auVar18,*(undefined4 *)(lVar7 + 0x24 + lVar14),0x28);
        auVar18 = insertps(ZEXT416(*(uint *)(lVar7 + 8 + lVar14)),
                           *(undefined4 *)(lVar7 + 0x18 + lVar14),0x1c);
        in_XMM11 = insertps(auVar18,*(undefined4 *)(lVar7 + 0x28 + lVar14),0x28);
        auVar18 = insertps(ZEXT416(*(uint *)(lVar7 + 0xc + lVar14)),
                           *(undefined4 *)(lVar7 + 0x1c + lVar14),0x1c);
        in_XMM1 = insertps(auVar18,*(undefined4 *)(lVar7 + 0x2c + lVar14),0x28);
      }
      else if (iVar3 == 0x9234) {
        lVar7 = *plVar6;
        lVar14 = plVar6[2] * uVar13;
        uVar1 = *(undefined8 *)(lVar7 + 4 + lVar14);
        in_XMM0._4_4_ = (float)(int)uVar1;
        in_XMM0._0_4_ = (float)*(undefined4 *)(lVar7 + lVar14);
        in_XMM0._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
        in_XMM0._12_4_ = 0.0;
        uVar1 = *(undefined8 *)(lVar7 + 0x10 + lVar14);
        in_XMM12._4_4_ = (int)uVar1;
        in_XMM12._0_4_ = *(undefined4 *)(lVar7 + 0xc + lVar14);
        in_XMM12._8_4_ = (int)((ulong)uVar1 >> 0x20);
        in_XMM12._12_4_ = 0;
        uVar1 = *(undefined8 *)(lVar7 + 0x1c + lVar14);
        in_XMM11._4_4_ = (int)uVar1;
        in_XMM11._0_4_ = *(undefined4 *)(lVar7 + 0x18 + lVar14);
        in_XMM11._8_4_ = (int)((ulong)uVar1 >> 0x20);
        in_XMM11._12_4_ = 0;
        uVar1 = *(undefined8 *)(lVar7 + 0x28 + lVar14);
        in_XMM1._4_4_ = (int)uVar1;
        in_XMM1._0_4_ = *(undefined4 *)(lVar7 + 0x24 + lVar14);
        in_XMM1._8_4_ = (int)((ulong)uVar1 >> 0x20);
        in_XMM1._12_4_ = 0;
      }
      else if (iVar3 == 0xb001) {
        lVar7 = *plVar6;
        lVar14 = plVar6[2] * uVar13;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)(lVar7 + 0x10 + lVar14);
        auVar48 = insertps(auVar48,*(undefined4 *)(lVar7 + 8 + lVar14),0x20);
        uVar1 = *(undefined8 *)(lVar7 + 0x34 + lVar14);
        auVar18._4_4_ = (int)uVar1;
        auVar18._0_4_ = *(undefined4 *)(lVar7 + lVar14);
        auVar18._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar18._12_4_ = 0;
        uVar1 = *(undefined8 *)(lVar7 + 0x1c + lVar14);
        auVar32._4_4_ = (int)uVar1;
        auVar32._0_4_ = *(undefined4 *)(lVar7 + 0x18 + lVar14);
        auVar32._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar32._12_4_ = 0;
        fVar16 = *(float *)(lVar7 + 0x24 + lVar14);
        fVar29 = *(float *)(lVar7 + 0x28 + lVar14);
        fVar35 = *(float *)(lVar7 + 0x2c + lVar14);
        fVar22 = *(float *)(lVar7 + 0x30 + lVar14);
        fVar38 = fVar22 * fVar22 + fVar35 * fVar35 + fVar16 * fVar16 + fVar29 * fVar29;
        auVar28 = rsqrtss(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
        fVar23 = auVar28._0_4_;
        fVar23 = fVar23 * fVar23 * fVar38 * -0.5 * fVar23 + fVar23 * 1.5;
        in_XMM1 = insertps(auVar32,ZEXT416((uint)(fVar16 * fVar23)),0x30);
        in_XMM0 = insertps(auVar18,ZEXT416((uint)(fVar29 * fVar23)),0x30);
        auVar28._0_4_ = fVar23 * fVar22;
        auVar18 = insertps(ZEXT416(*(uint *)(lVar7 + 0xc + lVar14)),
                           *(undefined4 *)(lVar7 + 4 + lVar14),0x10);
        in_XMM11 = insertps(auVar48,auVar28,0x30);
        auVar18 = insertps(auVar18,*(undefined4 *)(lVar7 + 0x3c + lVar14),0x20);
        in_XMM12 = insertps(auVar18,ZEXT416((uint)(fVar35 * fVar23)),0x30);
      }
      else if (iVar3 == 0x9244) {
        lVar7 = *plVar6;
        lVar14 = plVar6[2] * uVar13;
        in_XMM0 = *(undefined1 (*) [16])(lVar7 + lVar14);
        in_XMM12 = *(undefined1 (*) [16])(lVar7 + 0x10 + lVar14);
        in_XMM11 = *(undefined1 (*) [16])(lVar7 + 0x20 + lVar14);
        in_XMM1 = *(undefined1 (*) [16])(lVar7 + 0x30 + lVar14);
      }
      fVar35 = in_XMM1._12_4_;
      fVar16 = in_XMM0._0_4_;
      fVar29 = in_XMM0._12_4_;
      fVar51 = in_XMM12._0_4_;
      fVar53 = in_XMM12._4_4_;
      fVar41 = in_XMM12._12_4_;
      fVar47 = in_XMM11._0_4_;
      fVar49 = in_XMM11._4_4_;
      fVar50 = in_XMM11._8_4_;
      fVar39 = in_XMM11._12_4_;
      fVar38 = fVar29 * fVar41 + fVar39 * fVar35;
      fVar22 = fVar29 * fVar41 - fVar39 * fVar35;
      fVar23 = fVar35 * fVar35 + fVar29 * fVar29 + -fVar41 * fVar41 + -fVar39 * fVar39;
      fVar54 = fVar35 * fVar35 - fVar29 * fVar29;
      fVar46 = fVar41 * fVar41 + fVar54 + -fVar39 * fVar39;
      fVar55 = fVar29 * fVar39 - fVar41 * fVar35;
      fVar40 = fVar41 * fVar35 + fVar29 * fVar39;
      fVar52 = fVar41 * fVar39 + fVar29 * fVar35;
      fVar29 = fVar41 * fVar39 - fVar29 * fVar35;
      fVar38 = fVar38 + fVar38;
      fVar55 = fVar55 + fVar55;
      fVar35 = fVar39 * fVar39 + fVar54 + -fVar41 * fVar41;
      fVar54 = fVar23 * 1.0 + fVar38 * 0.0 + fVar55 * 0.0;
      fVar43 = fVar23 * 0.0 + fVar38 * 1.0 + fVar55 * 0.0;
      fVar44 = fVar23 * 0.0 + fVar38 * 0.0 + fVar55 * 1.0;
      fVar55 = fVar23 * 0.0 + fVar38 * 0.0 + fVar55 * 0.0;
      fVar52 = fVar52 + fVar52;
      fVar22 = fVar22 + fVar22;
      fVar23 = fVar22 * 1.0 + fVar46 * 0.0 + fVar52 * 0.0;
      fVar38 = fVar22 * 0.0 + fVar46 * 1.0 + fVar52 * 0.0;
      fVar39 = fVar22 * 0.0 + fVar46 * 0.0 + fVar52 * 1.0;
      fVar22 = fVar22 * 0.0 + fVar46 * 0.0 + fVar52 * 0.0;
      auVar45._0_8_ = in_XMM0._4_8_;
      auVar45._8_8_ = 0;
      auVar18 = blendps(auVar45,in_XMM12,4);
      fVar40 = fVar40 + fVar40;
      fVar29 = fVar29 + fVar29;
      fVar46 = fVar40 * 1.0 + fVar29 * 0.0 + fVar35 * 0.0;
      fVar52 = fVar40 * 0.0 + fVar29 * 1.0 + fVar35 * 0.0;
      fVar41 = fVar40 * 0.0 + fVar29 * 0.0 + fVar35 * 1.0;
      fVar35 = fVar40 * 0.0 + fVar29 * 0.0 + fVar35 * 0.0;
      local_48._0_4_ = in_XMM1._0_4_;
      local_48._4_4_ = in_XMM1._4_4_;
      uStack_40._0_4_ = in_XMM1._8_4_;
      fVar29 = fVar35 * 0.0;
      in_XMM0._0_4_ = fVar16 * fVar54 + fVar23 * 0.0 + fVar46 * 0.0;
      in_XMM0._4_4_ = fVar16 * fVar43 + fVar38 * 0.0 + fVar52 * 0.0;
      in_XMM0._8_4_ = fVar16 * fVar44 + fVar39 * 0.0 + fVar41 * 0.0;
      in_XMM0._12_4_ = fVar16 * fVar55 + fVar22 * 0.0 + fVar29;
      in_XMM7._0_4_ = fVar51 * fVar54 + fVar53 * fVar23 + fVar46 * 0.0;
      in_XMM7._4_4_ = fVar51 * fVar43 + fVar53 * fVar38 + fVar52 * 0.0;
      in_XMM7._8_4_ = fVar51 * fVar44 + fVar53 * fVar39 + fVar41 * 0.0;
      in_XMM7._12_4_ = fVar51 * fVar55 + fVar53 * fVar22 + fVar29;
      in_XMM4._0_4_ = fVar47 * fVar54 + fVar49 * fVar23 + fVar50 * fVar46;
      in_XMM4._4_4_ = fVar47 * fVar43 + fVar49 * fVar38 + fVar50 * fVar52;
      in_XMM4._8_4_ = fVar47 * fVar44 + fVar49 * fVar39 + fVar50 * fVar41;
      in_XMM4._12_4_ = fVar47 * fVar55 + fVar49 * fVar22 + fVar50 * fVar35;
      auVar36._0_4_ =
           (float)local_48 * fVar54 + local_48._4_4_ * fVar23 + (float)uStack_40 * fVar46 +
           auVar18._0_4_ + 0.0;
      auVar36._4_4_ =
           (float)local_48 * fVar43 + local_48._4_4_ * fVar38 + (float)uStack_40 * fVar52 +
           auVar18._4_4_ + 0.0;
      auVar36._8_4_ =
           (float)local_48 * fVar44 + local_48._4_4_ * fVar39 + (float)uStack_40 * fVar41 +
           auVar18._8_4_ + 0.0;
    }
    else if (iVar3 == 0x9134) {
      lVar7 = *plVar6;
      lVar14 = plVar6[2] * uVar13;
      auVar18 = insertps(ZEXT416(*(uint *)(lVar7 + lVar14)),*(undefined4 *)(lVar7 + 0x10 + lVar14),
                         0x1c);
      in_XMM0 = insertps(auVar18,*(undefined4 *)(lVar7 + 0x20 + lVar14),0x28);
      auVar18 = insertps(ZEXT416(*(uint *)(lVar7 + 4 + lVar14)),
                         *(undefined4 *)(lVar7 + 0x14 + lVar14),0x1c);
      in_XMM7 = insertps(auVar18,*(undefined4 *)(lVar7 + 0x24 + lVar14),0x28);
      auVar18 = insertps(ZEXT416(*(uint *)(lVar7 + 8 + lVar14)),
                         *(undefined4 *)(lVar7 + 0x18 + lVar14),0x1c);
      in_XMM4 = insertps(auVar18,*(undefined4 *)(lVar7 + 0x28 + lVar14),0x28);
      auVar18 = insertps(ZEXT416(*(uint *)(lVar7 + 0xc + lVar14)),
                         *(undefined4 *)(lVar7 + 0x1c + lVar14),0x1c);
      auVar18 = insertps(auVar18,*(undefined4 *)(lVar7 + 0x2c + lVar14),0x28);
      auVar36 = auVar18._0_12_;
    }
    else if (iVar3 == 0x9234) {
      lVar7 = *plVar6;
      lVar14 = plVar6[2] * uVar13;
      uVar1 = *(undefined8 *)(lVar7 + 4 + lVar14);
      in_XMM0._4_4_ = (float)(int)uVar1;
      in_XMM0._0_4_ = (float)*(undefined4 *)(lVar7 + lVar14);
      in_XMM0._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
      in_XMM0._12_4_ = 0.0;
      uVar1 = *(undefined8 *)(lVar7 + 0x10 + lVar14);
      in_XMM7._4_4_ = (float)(int)uVar1;
      in_XMM7._0_4_ = (float)*(undefined4 *)(lVar7 + 0xc + lVar14);
      in_XMM7._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
      in_XMM7._12_4_ = 0.0;
      uVar1 = *(undefined8 *)(lVar7 + 0x1c + lVar14);
      in_XMM4._4_4_ = (float)(int)uVar1;
      in_XMM4._0_4_ = (float)*(undefined4 *)(lVar7 + 0x18 + lVar14);
      in_XMM4._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
      in_XMM4._12_4_ = 0.0;
      uVar1 = *(undefined8 *)(lVar7 + 0x28 + lVar14);
      auVar36._4_4_ = (float)(int)uVar1;
      auVar36._0_4_ = (float)*(undefined4 *)(lVar7 + 0x24 + lVar14);
      auVar36._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
    }
    else if (iVar3 == 0xb001) {
      lVar7 = *plVar6;
      lVar14 = plVar6[2] * uVar13;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(lVar7 + 0x10 + lVar14);
      auVar18 = insertps(auVar30,*(undefined4 *)(lVar7 + 8 + lVar14),0x20);
      uVar1 = *(undefined8 *)(lVar7 + 0x34 + lVar14);
      auVar17._4_4_ = (int)uVar1;
      auVar17._0_4_ = *(undefined4 *)(lVar7 + lVar14);
      auVar17._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar17._12_4_ = 0;
      uVar1 = *(undefined8 *)(lVar7 + 0x1c + lVar14);
      auVar37._4_4_ = (int)uVar1;
      auVar37._0_4_ = *(undefined4 *)(lVar7 + 0x18 + lVar14);
      auVar37._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar37._12_4_ = 0;
      fVar16 = *(float *)(lVar7 + 0x24 + lVar14);
      fVar29 = *(float *)(lVar7 + 0x28 + lVar14);
      fVar35 = *(float *)(lVar7 + 0x2c + lVar14);
      fVar22 = *(float *)(lVar7 + 0x30 + lVar14);
      fVar38 = fVar22 * fVar22 + fVar35 * fVar35 + fVar16 * fVar16 + fVar29 * fVar29;
      auVar32 = rsqrtss(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
      fVar23 = auVar32._0_4_;
      auVar42._4_12_ = auVar32._4_12_;
      fVar23 = fVar23 * fVar23 * fVar38 * -0.5 * fVar23 + fVar23 * 1.5;
      auVar32 = insertps(auVar37,ZEXT416((uint)(fVar16 * fVar23)),0x30);
      auVar36 = auVar32._0_12_;
      in_XMM0 = insertps(auVar17,ZEXT416((uint)(fVar29 * fVar23)),0x30);
      auVar42._0_4_ = fVar23 * fVar22;
      auVar32 = insertps(ZEXT416(*(uint *)(lVar7 + 0xc + lVar14)),
                         *(undefined4 *)(lVar7 + 4 + lVar14),0x10);
      in_XMM4 = insertps(auVar18,auVar42,0x30);
      auVar18 = insertps(auVar32,*(undefined4 *)(lVar7 + 0x3c + lVar14),0x20);
      in_XMM7 = insertps(auVar18,ZEXT416((uint)(fVar35 * fVar23)),0x30);
    }
    else if (iVar3 == 0x9244) {
      lVar7 = *plVar6;
      lVar14 = plVar6[2] * uVar13;
      in_XMM0 = *(undefined1 (*) [16])(lVar7 + lVar14);
      in_XMM7 = *(undefined1 (*) [16])(lVar7 + 0x10 + lVar14);
      in_XMM4 = *(undefined1 (*) [16])(lVar7 + 0x20 + lVar14);
      auVar36 = SUB1612(*(undefined1 (*) [16])(lVar7 + 0x30 + lVar14),0);
    }
    fVar38 = in_XMM4._0_4_;
    fVar39 = in_XMM4._4_4_;
    fVar40 = in_XMM4._8_4_;
    fVar46 = in_XMM4._12_4_;
    fVar52 = in_XMM7._0_4_;
    fVar41 = in_XMM7._4_4_;
    fVar54 = in_XMM7._8_4_;
    fVar16 = in_XMM0._0_4_;
    fVar29 = in_XMM0._4_4_;
    fVar35 = in_XMM0._8_4_;
    auVar21._0_4_ = fVar52 * fVar39 - fVar41 * fVar38;
    fVar22 = fVar41 * fVar40 - fVar54 * fVar39;
    fVar23 = fVar54 * fVar38 - fVar52 * fVar40;
    auVar24._4_4_ = fVar23;
    auVar24._0_4_ = fVar22;
    auVar24._8_4_ = auVar21._0_4_;
    auVar24._12_4_ = in_XMM7._12_4_ * fVar46 - in_XMM7._12_4_ * fVar46;
    auVar31._0_4_ = fVar38 * fVar29 - fVar39 * fVar16;
    auVar31._4_4_ = fVar39 * fVar35 - fVar40 * fVar29;
    auVar31._8_4_ = fVar40 * fVar16 - fVar38 * fVar35;
    auVar31._12_4_ = fVar46 * in_XMM0._12_4_ - fVar46 * in_XMM0._12_4_;
    fVar38 = fVar29 * fVar54 - fVar35 * fVar41;
    auVar18 = dpps(in_XMM0,auVar24,0x7f);
    auVar32 = insertps(auVar31,auVar31,0x4a);
    auVar21._4_4_ = auVar31._0_4_;
    auVar21._8_4_ = fVar16 * fVar41 - fVar29 * fVar52;
    auVar21._12_4_ = 0;
    auVar27._4_4_ = fVar38;
    auVar27._0_4_ = fVar22;
    auVar27._8_4_ = fVar38;
    auVar27._12_4_ = auVar32._4_4_;
    auVar26._8_8_ = auVar27._8_8_;
    auVar26._4_4_ = auVar32._0_4_;
    auVar26._0_4_ = fVar22;
    auVar25._4_4_ = auVar32._8_4_;
    auVar25._0_4_ = fVar23;
    auVar25._8_4_ = fVar35 * fVar52 - fVar16 * fVar54;
    auVar25._12_4_ = auVar32._12_4_;
    auVar19._0_4_ = auVar18._0_4_;
    auVar19._4_4_ = auVar19._0_4_;
    auVar19._8_4_ = auVar19._0_4_;
    auVar19._12_4_ = auVar19._0_4_;
    auVar28 = divps(auVar26,auVar19);
    auVar32 = divps(auVar25,auVar19);
    auVar18 = divps(auVar21,auVar19);
    fVar43 = auVar36._0_4_;
    fVar44 = auVar36._4_4_;
    fVar55 = auVar36._8_4_;
    fVar16 = auVar18._0_4_;
    fVar29 = auVar18._4_4_;
    fVar35 = auVar18._8_4_;
    fVar22 = auVar18._12_4_;
    fVar23 = auVar32._0_4_;
    fVar38 = auVar32._4_4_;
    fVar39 = auVar32._8_4_;
    fVar40 = auVar32._12_4_;
    fVar46 = auVar28._0_4_;
    fVar52 = auVar28._4_4_;
    fVar41 = auVar28._8_4_;
    fVar54 = auVar28._12_4_;
    p_Var15 = *(_func_int **)&pGVar4->field_0x58;
    if (p_Var15 == (_func_int *)0x0) {
      p_Var15 = pGVar4[1].super_RefCount._vptr_RefCount
                [*(uint *)(*(long *)&pGVar4[1].time_range.upper +
                          uVar13 * (long)pGVar4[1].intersectionFilterN)];
    }
    fVar47 = (ray->org).field_0.m128[0];
    fVar49 = (ray->org).field_0.m128[1];
    fVar50 = (ray->org).field_0.m128[2];
    auVar36 = *(undefined1 (*) [12])&(ray->org).field_0;
    aVar10 = (ray->org).field_0;
    fVar51 = (ray->dir).field_0.m128[0];
    fVar53 = (ray->dir).field_0.m128[1];
    uVar1 = *(undefined8 *)&(ray->dir).field_0;
    pfVar9 = (ray->dir).field_0.m128 + 2;
    fVar8 = *pfVar9;
    uVar11 = *(undefined8 *)pfVar9;
    auVar33._0_4_ =
         fVar47 * fVar46 +
         fVar49 * fVar23 + (fVar50 * fVar16 - (fVar43 * fVar46 + fVar44 * fVar23 + fVar55 * fVar16))
    ;
    auVar33._4_4_ =
         fVar47 * fVar52 +
         fVar49 * fVar38 + (fVar50 * fVar29 - (fVar43 * fVar52 + fVar44 * fVar38 + fVar55 * fVar29))
    ;
    auVar33._8_4_ =
         fVar47 * fVar41 +
         fVar49 * fVar39 + (fVar50 * fVar35 - (fVar43 * fVar41 + fVar44 * fVar39 + fVar55 * fVar35))
    ;
    auVar33._12_4_ =
         fVar47 * fVar54 +
         fVar49 * fVar40 + (fVar50 * fVar22 - (fVar43 * fVar54 + fVar44 * fVar40 + fVar55 * fVar22))
    ;
    aVar34 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar33,(ray->org).field_0.m128[3],0x30);
    (ray->org).field_0 = aVar34;
    auVar20._0_4_ = fVar51 * fVar46 + fVar53 * fVar23 + fVar8 * fVar16;
    auVar20._4_4_ = fVar51 * fVar52 + fVar53 * fVar38 + fVar8 * fVar29;
    auVar20._8_4_ = fVar51 * fVar41 + fVar53 * fVar39 + fVar8 * fVar35;
    auVar20._12_4_ = fVar51 * fVar54 + fVar53 * fVar40 + fVar8 * fVar22;
    aVar34 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar20,(ray->dir).field_0.m128[3],0x30);
    (ray->dir).field_0 = aVar34;
    (**(code **)(p_Var15 + 0x80))(p_Var15 + 0x58,ray);
    local_48 = auVar36._0_8_;
    uStack_40 = aVar10._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_48;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_40;
    *(undefined8 *)&(ray->dir).field_0 = uVar1;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uVar11;
    bVar12 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar5->instID[0] = 0xffffffff;
    pRVar5->instPrimID[0] = 0xffffffff;
  }
  return bVar12;
}

Assistant:

bool InstanceArrayIntersector1::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        Accel* object = instance->getObject(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }